

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace_desc_array_access_using_var_index.cpp
# Opt level: O1

Instruction * __thiscall
spvtools::opt::ReplaceDescArrayAccessUsingVarIndex::GetConstNull
          (ReplaceDescArrayAccessUsingVarIndex *this,uint32_t type_id)

{
  IRContext *pIVar1;
  Type *type;
  Constant *c;
  Instruction *pIVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  
  if (type_id != 0) {
    pIVar1 = (this->super_Pass).context_;
    if ((pIVar1->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
      IRContext::BuildTypeManager(pIVar1);
    }
    type = analysis::TypeManager::GetType
                     ((pIVar1->type_mgr_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                      .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>.
                      _M_head_impl,type_id);
    pIVar1 = (this->super_Pass).context_;
    if ((pIVar1->valid_analyses_ & kAnalysisConstants) == kAnalysisNone) {
      IRContext::BuildConstantManager(pIVar1);
    }
    local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    c = analysis::ConstantManager::GetConstant
                  ((pIVar1->constant_mgr_)._M_t.
                   super___uniq_ptr_impl<spvtools::opt::analysis::ConstantManager,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spvtools::opt::analysis::ConstantManager_*,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
                   .super__Head_base<0UL,_spvtools::opt::analysis::ConstantManager_*,_false>.
                   _M_head_impl,type,&local_38);
    if (local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    pIVar1 = (this->super_Pass).context_;
    if ((pIVar1->valid_analyses_ & kAnalysisConstants) == kAnalysisNone) {
      IRContext::BuildConstantManager(pIVar1);
    }
    pIVar2 = analysis::ConstantManager::GetDefiningInstruction
                       ((pIVar1->constant_mgr_)._M_t.
                        super___uniq_ptr_impl<spvtools::opt::analysis::ConstantManager,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spvtools::opt::analysis::ConstantManager_*,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
                        .super__Head_base<0UL,_spvtools::opt::analysis::ConstantManager_*,_false>.
                        _M_head_impl,c,0,(inst_iterator *)0x0);
    return pIVar2;
  }
  __assert_fail("type_id != 0 && \"Result type is expected\"",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/replace_desc_array_access_using_var_index.cpp"
                ,0x17a,
                "Instruction *spvtools::opt::ReplaceDescArrayAccessUsingVarIndex::GetConstNull(uint32_t) const"
               );
}

Assistant:

Instruction* ReplaceDescArrayAccessUsingVarIndex::GetConstNull(
    uint32_t type_id) const {
  assert(type_id != 0 && "Result type is expected");
  auto* type = context()->get_type_mgr()->GetType(type_id);
  auto* null_const = context()->get_constant_mgr()->GetConstant(type, {});
  return context()->get_constant_mgr()->GetDefiningInstruction(null_const);
}